

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_number_isInteger(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  JSValue JVar2;
  
  uVar1 = JS_NumberIsInteger(ctx,*argv);
  JVar2.u._1_7_ = 0;
  JVar2.u.int32._0_1_ = 0 < (int)uVar1;
  JVar2.tag = (ulong)(uVar1 >> 0x1f) * 5 + 1;
  return JVar2;
}

Assistant:

static JSValue js_number_isInteger(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    int ret;
    ret = JS_NumberIsInteger(ctx, argv[0]);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}